

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O0

int uv__async_start(uv_loop_t *loop)

{
  int fd;
  int *piVar1;
  int err;
  int pipefd [2];
  uv_loop_t *loop_local;
  
  if ((loop->async_io_watcher).fd == -1) {
    fd = eventfd(0,0x80800);
    if (fd < 0) {
      piVar1 = __errno_location();
      loop_local._4_4_ = -*piVar1;
    }
    else {
      uv__io_init(&loop->async_io_watcher,uv__async_io,fd);
      uv__io_start(loop,&loop->async_io_watcher,1);
      loop->async_wfd = -1;
      loop_local._4_4_ = 0;
    }
  }
  else {
    loop_local._4_4_ = 0;
  }
  return loop_local._4_4_;
}

Assistant:

static int uv__async_start(uv_loop_t* loop) {
  int pipefd[2];
  int err;

  if (loop->async_io_watcher.fd != -1)
    return 0;

#ifdef __linux__
  err = eventfd(0, EFD_CLOEXEC | EFD_NONBLOCK);
  if (err < 0)
    return UV__ERR(errno);

  pipefd[0] = err;
  pipefd[1] = -1;
#else
  err = uv__make_pipe(pipefd, UV__F_NONBLOCK);
  if (err < 0)
    return err;
#endif

  uv__io_init(&loop->async_io_watcher, uv__async_io, pipefd[0]);
  uv__io_start(loop, &loop->async_io_watcher, POLLIN);
  loop->async_wfd = pipefd[1];

  return 0;
}